

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_failprob.c
# Opt level: O2

int zero_overhead_test(int K,int nTest,float loss)

{
  long lVar1;
  RqInterProgram *__ptr;
  float loss_00;
  int iVar2;
  ulong uVar3;
  uint32_t *ESIs;
  uint uVar4;
  undefined8 uStack_60;
  uint32_t auStack_58 [2];
  ulong local_50;
  RqInterProgram *local_48;
  RqInterProgram *program;
  float local_38;
  uint local_34;
  
  if (nTest < 1) {
    nTest = 0;
  }
  local_50 = (ulong)(uint)K * 4 + 0xf & 0xfffffffffffffff0;
  uVar4 = 0;
  local_34 = 0;
  program._4_4_ = nTest;
  local_38 = loss;
  do {
    loss_00 = local_38;
    if (program._4_4_ == uVar4) {
      return local_34;
    }
    lVar1 = -local_50;
    ESIs = (uint32_t *)((long)auStack_58 + lVar1);
    if ((local_38 != 1.0) || (NAN(local_38))) {
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x101443;
      get_esis_after_loss(K,ESIs,loss_00);
    }
    else {
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x101436;
      get_random_esis(K,ESIs);
    }
    local_48 = (RqInterProgram *)0x0;
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10145a;
    iVar2 = getProgram(K,K,ESIs,&local_48);
    if (iVar2 != 0) {
      if (iVar2 != -4) {
        return -1;
      }
      local_34 = local_34 + 1;
    }
    if ((uVar4 / 1000) * 1000 == uVar4) {
      uVar3 = (ulong)local_34;
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x101486;
      printf("   Completed test %d, nFail=%d\n",(ulong)uVar4,uVar3);
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x101495;
      fflush(_stdout);
    }
    __ptr = local_48;
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10149e;
    free(__ptr);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int zero_overhead_test(int K, int nTest, float loss)
{
#define RUN_NOFAIL(x) \
	do { \
		int RUN_NOFAIL_err; \
		if ((RUN_NOFAIL_err = (x)) != 0) { \
			fprintf(stderr, "Error:%s:%d:  %s failed: %d\n", \
				__FILE__, __LINE__, #x, RUN_NOFAIL_err); \
			if (config) \
				free(config); \
			return -1; \
		} \
	} while(0)

	int nFail = 0;
	for (int i = 0; i < nTest; ++i) {
		uint32_t ESIs[K];
		if (loss == 1) {
			get_random_esis(K, ESIs);
		} else {
			get_esis_after_loss(K, ESIs, loss);
		}

		/* Create the program */
		RqInterProgram* program = NULL;
		int err = getProgram(K, K, ESIs, &program);
		switch (err) {
		case 0:						break;
		case RQ_ERR_INSUFF_IDS:	++nFail;	break;
		default:
			return -1;
		};

		if (i % 1000 == 0) {
			printf("   Completed test %d, nFail=%d\n", i, nFail);
			fflush(stdout);
		}

		free(program);
	}

#undef RUN_NOFAIL
	return nFail;
}